

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserMhapTest_CompressedParseInChunks_Test::
~BioparserMhapTest_CompressedParseInChunks_Test
          (BioparserMhapTest_CompressedParseInChunks_Test *this)

{
  BioparserMhapTest_CompressedParseInChunks_Test *this_local;
  
  ~BioparserMhapTest_CompressedParseInChunks_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, CompressedParseInChunks) {
  Setup("sample.mhap.gz");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}